

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O3

bool __thiscall glu::ContextInfo::isCompressedTextureFormatSupported(ContextInfo *this,int format)

{
  set<int,_std::less<int>,_std::allocator<int>_> *psVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  
  psVar1 = CachedValue<std::set<int,_std::less<int>,_std::allocator<int>_>,_glu::GetCompressedTextureFormats>
           ::getValue(&this->m_compressedTextureFormats,this->m_context);
  p_Var4 = (psVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &(psVar1->_M_t)._M_impl.super__Rb_tree_header;
  p_Var3 = &p_Var2->_M_header;
  p_Var5 = &p_Var2->_M_header;
  if (p_Var4 != (_Base_ptr)0x0) {
    do {
      if (format <= (int)p_Var4[1]._M_color) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < format];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var2) && (p_Var5 = p_Var3, format < (int)p_Var3[1]._M_color)
       ) {
      p_Var5 = &p_Var2->_M_header;
    }
  }
  return (_Rb_tree_header *)p_Var5 != p_Var2;
}

Assistant:

bool ContextInfo::isCompressedTextureFormatSupported (int format) const
{
	const set<int>& formats = m_compressedTextureFormats.getValue(m_context);
	return formats.find(format) != formats.end();
}